

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2.c
# Opt level: O0

int SM2_CTX_init(SM2_CTX *sm2_ctx,uint8_t *pubkey_x,uint8_t *pubkey_y)

{
  int iVar1;
  EC_GROUP *pEVar2;
  BN_CTX *ctx;
  BIGNUM *ret_00;
  EC_POINT *point_00;
  uchar *in_RDX;
  uchar *in_RSI;
  long *in_RDI;
  EC_POINT *point;
  BN_CTX *bn_ctx;
  BIGNUM *y;
  BIGNUM *x;
  int ret;
  int local_24;
  int local_4;
  
  local_24 = 0;
  if (in_RDI == (long *)0x0) {
    local_4 = 0;
  }
  else {
    CRYPTO_crit_enter();
    in_RDI[1] = 0;
    pEVar2 = SM2_get_group();
    *in_RDI = (long)pEVar2;
    if (*in_RDI == 0) {
      CRYPTO_crit_leave();
      local_4 = 0;
    }
    else if ((in_RSI == (uchar *)0x0) || (in_RDX == (uchar *)0x0)) {
      CRYPTO_crit_leave();
      local_4 = 1;
    }
    else {
      ctx = BN_CTX_new();
      ret_00 = BN_new();
      pEVar2 = (EC_GROUP *)BN_new();
      point_00 = (EC_POINT *)EC_POINT_new((EC_GROUP *)*in_RDI);
      if ((((ret_00 != (BIGNUM *)0x0) && (pEVar2 != (EC_GROUP *)0x0)) && (ctx != (BN_CTX *)0x0)) &&
         (point_00 != (EC_POINT *)0x0)) {
        BN_bin2bn(in_RSI,0x20,ret_00);
        BN_bin2bn(in_RDX,0x20,(BIGNUM *)pEVar2);
        iVar1 = EC_POINT_set_affine_coordinates_GFp
                          ((EC_GROUP *)*in_RDI,(EC_POINT *)point_00,ret_00,(BIGNUM *)pEVar2,ctx);
        if ((iVar1 != 0) &&
           (iVar1 = EC_GROUP_point_precompute_mult(pEVar2,ctx,point_00,(BN_CTX *)0x12aa25),
           iVar1 != 0)) {
          CRYPTO_memzero(ctx,(size_t)point_00);
          local_24 = 1;
        }
      }
      BN_free(ret_00);
      BN_free((BIGNUM *)pEVar2);
      BN_CTX_free(ctx);
      EC_POINT_free((EC_POINT *)point_00);
      CRYPTO_crit_leave();
      local_4 = local_24;
    }
  }
  return local_4;
}

Assistant:

int SM2_CTX_init(SM2_CTX *sm2_ctx, uint8_t pubkey_x[32], uint8_t pubkey_y[32])
{
    int ret = GML_ERROR;
    BIGNUM *x = NULL;
    BIGNUM *y = NULL;
    BN_CTX *bn_ctx = NULL;
    EC_POINT *point = NULL;
    if (sm2_ctx == NULL)
        return GML_ERROR;

    CRYPTO_crit_enter();

    sm2_ctx->pk_precomp = NULL;
    sm2_ctx->group = (EC_GROUP*)SM2_get_group();
    if (sm2_ctx->group == NULL) {
        CRYPTO_crit_leave();
        return GML_ERROR;
    }

    /* no precompute */
    if (pubkey_x == NULL || pubkey_y == NULL) {
        CRYPTO_crit_leave();
        return GML_OK;
    }

    bn_ctx = BN_CTX_new();
    x = BN_new();
    y = BN_new();
    point = EC_POINT_new(sm2_ctx->group);
    if (x == NULL || y == NULL || bn_ctx == NULL || point == NULL)
        goto end;

    BN_bin2bn(pubkey_x, 32, x);
    BN_bin2bn(pubkey_y, 32, y);
    if (EC_POINT_set_affine_coordinates_GFp(sm2_ctx->group, point, x, y, bn_ctx) == GML_ERROR) {
        goto end;
    }

    /* compute precompute table for point */
    if (EC_GROUP_point_precompute_mult(sm2_ctx->group, &sm2_ctx->pk_precomp, point, bn_ctx) == GML_ERROR) {
        goto end;
    }

    CRYPTO_memzero(sm2_ctx->sk_precomp, 64);

    ret = GML_OK;
end:
    BN_free(x);
    BN_free(y);
    BN_CTX_free(bn_ctx);
    EC_POINT_free(point);
    CRYPTO_crit_leave();
    return ret;
}